

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

bool __thiscall camp::UserObject::operator<(UserObject *this,UserObject *other)

{
  element_type *peVar1;
  UserProperty *pUVar2;
  UserProperty *pUVar3;
  int iVar4;
  int iVar5;
  ParentObject *pPVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  scoped_ptr<camp::ParentObject> *this_00;
  scoped_ptr<camp::ParentObject> *this_01;
  bool bVar7;
  
  do {
    peVar1 = (((ParentObject *)this)->object).m_holder.
             super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      if ((((ParentObject *)other)->object).m_holder.
          super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
LAB_001296e6:
        bVar7 = (((ParentObject *)other)->object).m_parent.px != (ParentObject *)0x0;
      }
      else {
        iVar4 = (*peVar1->_vptr_AbstractObjectHolder[2])();
        iVar5 = (*((((ParentObject *)other)->object).m_holder.
                   super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_AbstractObjectHolder[2])();
        bVar7 = CONCAT44(extraout_var,iVar4) < CONCAT44(extraout_var_00,iVar5);
      }
      return bVar7;
    }
    if ((((ParentObject *)this)->object).m_parent.px == (ParentObject *)0x0) {
      if ((((ParentObject *)other)->object).m_holder.
          super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        return true;
      }
      goto LAB_001296e6;
    }
    if ((((ParentObject *)other)->object).m_parent.px == (ParentObject *)0x0) {
      return false;
    }
    this_01 = &(((ParentObject *)this)->object).m_parent;
    this_00 = &(((ParentObject *)other)->object).m_parent;
    pPVar6 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
    pUVar2 = pPVar6->member;
    pPVar6 = boost::scoped_ptr<camp::ParentObject>::operator->(this_00);
    pUVar3 = pPVar6->member;
    this = &boost::scoped_ptr<camp::ParentObject>::operator->(this_01)->object;
    if (pUVar2 != pUVar3) {
      pUVar2 = ((ParentObject *)this)->member;
      pPVar6 = boost::scoped_ptr<camp::ParentObject>::operator->(this_00);
      return pUVar2 < pPVar6->member;
    }
    other = &boost::scoped_ptr<camp::ParentObject>::operator->(this_00)->object;
  } while( true );
}

Assistant:

bool UserObject::operator<(const UserObject& other) const
{
    if (m_holder)
    {
        if (other.m_holder)
        {
            return m_holder->object() < other.m_holder->object();
        }
        else
        {
            return other.m_parent != 0;
        }
    }
    else if (m_parent)
    {
        if (other.m_parent)
        {
            if (&m_parent->member != &other.m_parent->member)
                return &m_parent->member < &other.m_parent->member;
            else
                return m_parent->object < other.m_parent->object;
        }
        else
        {
            return false;
        }
    }
    else
    {
        return other.m_holder || other.m_parent;
    }
}